

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

bool __thiscall Loader::loadBin(Loader *this,string *file)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [36];
  int local_e4;
  duration<long,_std::ratio<1L,_1000L>_> local_e0;
  string local_d8 [32];
  undefined1 local_b8 [8];
  string reversedBinStr;
  string local_90 [48];
  string local_60 [32];
  undefined1 local_40 [8];
  string binStr;
  string *file_local;
  Loader *this_local;
  
  std::__cxx11::string::string(local_60,(string *)file);
  fileToBinStr((Loader *)local_40,(string *)this);
  std::__cxx11::string::~string(local_60);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string(local_d8,(string *)local_40);
    reverseBytes((Loader *)local_b8,(string *)this);
    std::__cxx11::string::~string(local_d8);
    bVar1 = Jtag::setFreq(this->device,10000000.0);
    if (bVar1) {
      bVar1 = resetState(this);
      if (bVar1) {
        bVar1 = setState(this,RUN_TEST_IDLE);
        if (bVar1) {
          bVar1 = setIR(this,JPROGRAM);
          if (bVar1) {
            bVar1 = setIR(this,ISC_NOOP);
            if (bVar1) {
              local_e4 = 100;
              std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1000l>> *)&local_e0,&local_e4);
              std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_e0);
              bVar1 = Jtag::sendClocks(this->device,10000);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_108,"14",&local_109);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_130,"11",&local_131);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_158,"31",&local_159);
                bVar1 = shiftIR(this,6,(string *)local_108,(string *)local_130,(string *)local_158);
                std::__cxx11::string::~string(local_158);
                std::allocator<char>::~allocator((allocator<char> *)&local_159);
                std::__cxx11::string::~string(local_130);
                std::allocator<char>::~allocator((allocator<char> *)&local_131);
                std::__cxx11::string::~string(local_108);
                std::allocator<char>::~allocator((allocator<char> *)&local_109);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  bVar1 = setIR(this,CFG_IN);
                  if (bVar1) {
                    iVar2 = std::__cxx11::string::length();
                    std::__cxx11::string::string(local_180,(string *)local_b8);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_1a0,"",&local_1a1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_1c8,"",&local_1c9);
                    bVar1 = shiftDR(this,iVar2 << 2,(string *)local_180,(string *)local_1a0,
                                    (string *)local_1c8);
                    std::__cxx11::string::~string(local_1c8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
                    std::__cxx11::string::~string(local_1a0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
                    std::__cxx11::string::~string(local_180);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      bVar1 = setState(this,RUN_TEST_IDLE);
                      if (bVar1) {
                        bVar1 = Jtag::sendClocks(this->device,100000);
                        if (bVar1) {
                          bVar1 = setIR(this,JSTART);
                          if (bVar1) {
                            bVar1 = setState(this,RUN_TEST_IDLE);
                            if (bVar1) {
                              bVar1 = Jtag::sendClocks(this->device,100);
                              if (bVar1) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_1f0,"09",&local_1f1);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_218,"31",&local_219);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_240,"11",&local_241);
                                bVar1 = shiftIR(this,6,(string *)local_1f0,(string *)local_218,
                                                (string *)local_240);
                                std::__cxx11::string::~string(local_240);
                                std::allocator<char>::~allocator((allocator<char> *)&local_241);
                                std::__cxx11::string::~string(local_218);
                                std::allocator<char>::~allocator((allocator<char> *)&local_219);
                                std::__cxx11::string::~string(local_1f0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  bVar1 = setState(this,TEST_LOGIC_RESET);
                                  if (bVar1) {
                                    bVar1 = Jtag::sendClocks(this->device,5);
                                    if (bVar1) {
                                      bVar1 = setIR(this,CFG_IN);
                                      if (bVar1) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  (local_268,
                                                   "0000000400000004800700140000000466aa9955",
                                                   &local_269);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string(local_290,"",&local_291);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string(local_2b8,"",&local_2b9);
                                        bVar1 = shiftDR(this,0xa0,(string *)local_268,
                                                        (string *)local_290,(string *)local_2b8);
                                        std::__cxx11::string::~string(local_2b8);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_2b9);
                                        std::__cxx11::string::~string(local_290);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_291);
                                        std::__cxx11::string::~string(local_268);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_269);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          bVar1 = setIR(this,CFG_OUT);
                                          if (bVar1) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_2e0,"00000000",&local_2e1);
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_308,"3f5e0d40",&local_309);
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_330,"08000000",&local_331);
                                            bVar1 = shiftDR(this,0x20,(string *)local_2e0,
                                                            (string *)local_308,(string *)local_330)
                                            ;
                                            std::__cxx11::string::~string(local_330);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_331);
                                            std::__cxx11::string::~string(local_308);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_309);
                                            std::__cxx11::string::~string(local_2e0);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_2e1);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              bVar1 = setState(this,TEST_LOGIC_RESET);
                                              if (bVar1) {
                                                bVar1 = Jtag::sendClocks(this->device,5);
                                                if (bVar1) {
                                                  this_local._7_1_ = true;
                                                }
                                                else {
                                                  this_local._7_1_ = false;
                                                }
                                              }
                                              else {
                                                this_local._7_1_ = false;
                                              }
                                            }
                                            else {
                                              this_local._7_1_ = false;
                                            }
                                          }
                                          else {
                                            this_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          this_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        this_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      this_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    this_local._7_1_ = false;
                                  }
                                }
                                else {
                                  this_local._7_1_ = false;
                                }
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to set JTAG frequency!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    std::operator+((char *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Failed to read bin file: ");
    poVar4 = std::operator<<((ostream *)&std::cerr,local_90);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Loader::loadBin(string file) {
	string binStr = fileToBinStr(file);

    if (binStr.empty()) {
        cerr << "Failed to read bin file: "+ file << endl;
        return false;
    }

	string reversedBinStr = reverseBytes(binStr);

	if (!device->setFreq(10000000)) {
		cerr << "Failed to set JTAG frequency!" << endl;
		return false;
	}
	if (!resetState())
		return false;
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;

	if (!setIR(JPROGRAM))
		return false;
	if (!setIR(ISC_NOOP))
		return false;
	std::this_thread::sleep_for(std::chrono::milliseconds(100));

	// config/jprog/poll
	if (!device->sendClocks(10000))
		return false;
	if (!shiftIR(6, "14", "11", "31"))
		return false;

	// config/slr
	if (!setIR(CFG_IN))
		return false;
	if (!shiftDR(binStr.length() * 4, reversedBinStr, "", ""))
		return false;

	// config/start
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;
	if (!device->sendClocks(100000))
		return false;
	if (!setIR(JSTART))
		return false;
	if (!setState(Jtag_fsm::RUN_TEST_IDLE))
		return false;
	if (!device->sendClocks(100))
		return false;
	if (!shiftIR(6, "09", "31", "11"))
		return false;

	// config/status
	if (!setState(Jtag_fsm::TEST_LOGIC_RESET))
		return false;
	if (!device->sendClocks(5))
		return false;
	if (!setIR(CFG_IN))
		return false;
	if (!shiftDR(160, "0000000400000004800700140000000466aa9955", "", ""))
		return false;
	if (!setIR(CFG_OUT))
		return false;
	if (!shiftDR(32, "00000000", "3f5e0d40", "08000000"))
		return false;
	if (!setState(Jtag_fsm::TEST_LOGIC_RESET))
		return false;
	if (!device->sendClocks(5))
		return false;

	return true;
}